

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int DecodeImageStream(int xsize,int ysize,int is_level0,VP8LDecoder *dec,uint32_t **decoded_data)

{
  VP8LBitReader *br;
  uint32_t **decoded_data_00;
  HuffmanTables *huffman_tables;
  ushort uVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  VP8LImageTransformType VVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  VP8StatusCode VVar8;
  VP8StatusCode VVar9;
  uint32_t *puVar10;
  ulong uVar11;
  int *piVar12;
  byte bVar13;
  VP8LTransform *pVVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  uint uVar18;
  int *mapping;
  uint32_t *huffman_image;
  HTreeGroup *local_40;
  uint32_t **local_38;
  
  br = &dec->br;
  local_38 = decoded_data;
  if (is_level0 == 0) {
LAB_0010c082:
    uVar15 = 1;
    uVar3 = VP8LReadBits(br,1);
    if (uVar3 != 0) {
      uVar3 = VP8LReadBits(br,4);
      if (uVar3 - 1 < 0xb) goto LAB_0010c0cc;
      VVar8 = dec->status;
      VVar9 = VP8_STATUS_BITSTREAM_ERROR;
      if (VVar8 != VP8_STATUS_OK) goto joined_r0x0010c0be;
      goto LAB_0010c408;
    }
    uVar3 = 0;
LAB_0010c0cc:
    huffman_image = (uint32_t *)0x0;
    local_40 = (HTreeGroup *)0x0;
    huffman_tables = &(dec->hdr).huffman_tables;
    if (is_level0 != 0) {
      uVar15 = 1;
      uVar7 = VP8LReadBits(br,1);
      if (uVar7 == 0) {
        mapping = (int *)0x0;
        uVar16 = uVar15;
        goto LAB_0010c1c8;
      }
      uVar7 = VP8LReadBits(br,3);
      uVar15 = 1;
      bVar13 = (byte)(uVar7 + 2);
      iVar5 = 1 << (bVar13 & 0x1f);
      uVar16 = (xsize + iVar5) - 1U >> (bVar13 & 0x1f);
      uVar18 = (ysize + iVar5) - 1U >> (bVar13 & 0x1f);
      mapping = (int *)0x0;
      iVar5 = DecodeImageStream(uVar16,uVar18,0,dec,&huffman_image);
      if (iVar5 != 0) {
        uVar16 = uVar16 * uVar18;
        (dec->hdr).huffman_subsample_bits = uVar7 + 2;
        piVar17 = (int *)(ulong)uVar16;
        if ((int)uVar16 < 1) {
          piVar17 = mapping;
        }
        for (; piVar17 != mapping; mapping = (int *)((long)mapping + 1)) {
          uVar1 = *(ushort *)((long)huffman_image + (long)mapping * 4 + 1);
          huffman_image[(long)mapping] = (uint)uVar1;
          if (uVar15 <= uVar1) {
            uVar15 = uVar1 + 1;
          }
        }
        if ((uVar15 < 0x3e9) && ((int)uVar15 <= xsize * ysize)) {
          mapping = (int *)0x0;
          uVar16 = uVar15;
        }
        else {
          mapping = (int *)WebPSafeMalloc((ulong)uVar15,4);
          if (mapping == (int *)0x0) {
            if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
              dec->status = VP8_STATUS_OUT_OF_MEMORY;
            }
            mapping = (int *)0x0;
            goto LAB_0010c1d4;
          }
          memset(mapping,0xff,(ulong)uVar15 << 2);
          uVar16 = 0;
          for (piVar12 = (int *)0x0; piVar17 != piVar12; piVar12 = (int *)((long)piVar12 + 1)) {
            uVar18 = mapping[huffman_image[(long)piVar12]];
            if (mapping[huffman_image[(long)piVar12]] == 0xffffffff) {
              mapping[huffman_image[(long)piVar12]] = uVar16;
              uVar18 = uVar16;
              uVar16 = uVar16 + 1;
            }
            huffman_image[(long)piVar12] = uVar18;
          }
        }
        goto LAB_0010c1c8;
      }
LAB_0010c1d4:
      WebPSafeFree(mapping);
      WebPSafeFree(huffman_image);
      VP8LHuffmanTablesDeallocate(huffman_tables);
      VP8LHtreeGroupsFree(local_40);
      goto LAB_0010c1f8;
    }
    mapping = (int *)0x0;
    uVar16 = uVar15;
LAB_0010c1c8:
    if (((dec->br).eos != 0) ||
       (iVar5 = ReadHuffmanCodesHelper(uVar3,uVar16,uVar15,mapping,dec,huffman_tables,&local_40),
       iVar5 == 0)) goto LAB_0010c1d4;
    (dec->hdr).huffman_image = huffman_image;
    (dec->hdr).num_htree_groups = uVar16;
    (dec->hdr).htree_groups = local_40;
    WebPSafeFree(mapping);
    if (0 < (int)uVar3) {
      VVar9 = VP8_STATUS_OUT_OF_MEMORY;
      (dec->hdr).color_cache_size = 1 << ((byte)uVar3 & 0x1f);
      iVar5 = VP8LColorCacheInit(&(dec->hdr).color_cache,uVar3);
      if (iVar5 != 0) goto LAB_0010c311;
      VVar8 = dec->status;
      goto LAB_0010c203;
    }
    (dec->hdr).color_cache_size = 0;
LAB_0010c311:
    iVar5 = (dec->hdr).huffman_subsample_bits;
    bVar13 = (byte)iVar5;
    iVar6 = 1;
    dec->width = xsize;
    dec->height = ysize;
    (dec->hdr).huffman_xsize = ((1 << (bVar13 & 0x1f)) + xsize) - 1U >> (bVar13 & 0x1f);
    (dec->hdr).huffman_mask = -(uint)(iVar5 == 0) | ~(-1 << (bVar13 & 0x1f));
    if (is_level0 != 0) {
      dec->state = READ_HDR;
      puVar10 = (uint32_t *)0x0;
LAB_0010c363:
      if (local_38 != (uint32_t **)0x0) {
        *local_38 = puVar10;
      }
      dec->last_pixel = 0;
      if (is_level0 != 0) {
        return 1;
      }
      goto LAB_0010c418;
    }
    puVar10 = (uint32_t *)WebPSafeMalloc((long)ysize * (long)xsize,4);
    if (puVar10 == (uint32_t *)0x0) {
      VVar8 = dec->status;
      VVar9 = VP8_STATUS_OUT_OF_MEMORY;
      goto LAB_0010c203;
    }
    iVar5 = DecodeImageData(dec,puVar10,xsize,ysize,ysize,(ProcessRowsFunc)0x0);
    if ((iVar5 != 0) && ((dec->br).eos == 0)) goto LAB_0010c363;
  }
  else {
    do {
      while( true ) {
        uVar3 = VP8LReadBits(br,1);
        if (uVar3 == 0) goto LAB_0010c082;
        iVar5 = dec->next_transform;
        VVar4 = VP8LReadBits(br,2);
        if ((dec->transforms_seen >> (VVar4 & 0x1f) & 1) != 0) goto LAB_0010c1f8;
        pVVar14 = dec->transforms + iVar5;
        dec->transforms_seen = dec->transforms_seen | 1 << ((byte)VVar4 & 0x1f);
        pVVar14->type = VVar4;
        pVVar14->xsize = xsize;
        pVVar14->ysize = ysize;
        decoded_data_00 = &pVVar14->data;
        pVVar14->data = (uint32_t *)0x0;
        dec->next_transform = dec->next_transform + 1;
        if (VVar4 < SUBTRACT_GREEN_TRANSFORM) break;
        if (VVar4 == COLOR_INDEXING_TRANSFORM) {
          uVar3 = VP8LReadBits(br,8);
          iVar5 = uVar3 + 1;
          uVar15 = 0;
          if ((iVar5 < 0x11) && (uVar15 = 1, iVar5 < 5)) {
            uVar15 = 2 < iVar5 ^ 3;
          }
          xsize = (pVVar14->xsize + (1 << (sbyte)uVar15)) - 1U >> (sbyte)uVar15;
          pVVar14->bits = uVar15;
          iVar6 = DecodeImageStream(iVar5,1,0,dec,decoded_data_00);
          if (iVar6 == 0) goto LAB_0010c1f8;
          bVar13 = (byte)(8L >> ((byte)pVVar14->bits & 0x3f));
          puVar10 = (uint32_t *)WebPSafeMalloc(1L << (bVar13 & 0x3f),4);
          if (puVar10 == (uint32_t *)0x0) {
            VVar8 = dec->status;
            VVar9 = VP8_STATUS_OUT_OF_MEMORY;
            if ((VVar8 == VP8_STATUS_OK) || (VVar8 == VP8_STATUS_SUSPENDED)) goto LAB_0010c408;
            goto LAB_0010c200;
          }
          puVar2 = *decoded_data_00;
          *puVar10 = *puVar2;
          for (uVar11 = 4; (long)uVar11 < (long)(iVar5 * 4); uVar11 = uVar11 + 1) {
            *(char *)((long)puVar10 + uVar11) =
                 *(char *)((long)puVar10 + (uVar11 - 4)) + *(char *)((long)puVar2 + uVar11);
          }
          for (; uVar11 < (uint)(4 << (bVar13 & 0x1f)); uVar11 = uVar11 + 1) {
            *(undefined1 *)((long)puVar10 + uVar11) = 0;
          }
          WebPSafeFree(*decoded_data_00);
          *decoded_data_00 = puVar10;
        }
      }
      uVar3 = VP8LReadBits(br,3);
      bVar13 = (byte)(uVar3 + 2);
      pVVar14->bits = uVar3 + 2;
      uVar15 = ~(-1 << (bVar13 & 0x1f));
      iVar5 = DecodeImageStream(pVVar14->xsize + uVar15 >> (bVar13 & 0x1f),
                                uVar15 + pVVar14->ysize >> (bVar13 & 0x1f),0,dec,decoded_data_00);
    } while (iVar5 != 0);
LAB_0010c1f8:
    VVar8 = dec->status;
LAB_0010c200:
    VVar9 = VP8_STATUS_BITSTREAM_ERROR;
LAB_0010c203:
    if (VVar8 == VP8_STATUS_OK) {
LAB_0010c408:
      dec->status = VVar9;
    }
    else {
joined_r0x0010c0be:
      if (VVar8 == VP8_STATUS_SUSPENDED) goto LAB_0010c408;
    }
    puVar10 = (uint32_t *)0x0;
  }
  WebPSafeFree(puVar10);
  iVar6 = 0;
LAB_0010c418:
  ClearMetadata(&dec->hdr);
  return iVar6;
}

Assistant:

static int DecodeImageStream(int xsize, int ysize,
                             int is_level0,
                             VP8LDecoder* const dec,
                             uint32_t** const decoded_data) {
  int ok = 1;
  int transform_xsize = xsize;
  int transform_ysize = ysize;
  VP8LBitReader* const br = &dec->br;
  VP8LMetadata* const hdr = &dec->hdr;
  uint32_t* data = NULL;
  int color_cache_bits = 0;

  // Read the transforms (may recurse).
  if (is_level0) {
    while (ok && VP8LReadBits(br, 1)) {
      ok = ReadTransform(&transform_xsize, &transform_ysize, dec);
    }
  }

  // Color cache
  if (ok && VP8LReadBits(br, 1)) {
    color_cache_bits = VP8LReadBits(br, 4);
    ok = (color_cache_bits >= 1 && color_cache_bits <= MAX_CACHE_BITS);
    if (!ok) {
      VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
      goto End;
    }
  }

  // Read the Huffman codes (may recurse).
  ok = ok && ReadHuffmanCodes(dec, transform_xsize, transform_ysize,
                              color_cache_bits, is_level0);
  if (!ok) {
    VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
    goto End;
  }

  // Finish setting up the color-cache
  if (color_cache_bits > 0) {
    hdr->color_cache_size = 1 << color_cache_bits;
    if (!VP8LColorCacheInit(&hdr->color_cache, color_cache_bits)) {
      ok = VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
      goto End;
    }
  } else {
    hdr->color_cache_size = 0;
  }
  UpdateDecoder(dec, transform_xsize, transform_ysize);

  if (is_level0) {   // level 0 complete
    dec->state = READ_HDR;
    goto End;
  }

  {
    const uint64_t total_size = (uint64_t)transform_xsize * transform_ysize;
    data = (uint32_t*)WebPSafeMalloc(total_size, sizeof(*data));
    if (data == NULL) {
      ok = VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
      goto End;
    }
  }

  // Use the Huffman trees to decode the LZ77 encoded data.
  ok = DecodeImageData(dec, data, transform_xsize, transform_ysize,
                       transform_ysize, NULL);
  ok = ok && !br->eos;

 End:
  if (!ok) {
    WebPSafeFree(data);
    ClearMetadata(hdr);
  } else {
    if (decoded_data != NULL) {
      *decoded_data = data;
    } else {
      // We allocate image data in this function only for transforms. At level 0
      // (that is: not the transforms), we shouldn't have allocated anything.
      assert(data == NULL);
      assert(is_level0);
    }
    dec->last_pixel = 0;  // Reset for future DECODE_DATA_FUNC() calls.
    if (!is_level0) ClearMetadata(hdr);  // Clean up temporary data behind.
  }
  return ok;
}